

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::type_to_glsl_abi_cxx11_
          (CompilerMSL *this,SPIRType *type,uint32_t id,bool member)

{
  undefined4 uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  char *pcVar5;
  SPIRType *pSVar6;
  SPIRType *pSVar7;
  CompilerError *pCVar8;
  size_t sVar9;
  undefined7 in_register_00000009;
  ulong uVar10;
  undefined4 in_register_00000014;
  byte in_R8B;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308 [32];
  undefined1 local_2e8 [44];
  uint32_t i;
  string sizes;
  __cxx11 local_298 [32];
  __cxx11 local_278 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258 [32];
  string local_238 [32];
  SPIRVariable *local_218;
  SPIRVariable *var_1;
  string local_208 [38];
  undefined1 local_1e2;
  allocator local_1e1;
  string local_1e0 [38];
  undefined1 local_1ba;
  allocator local_1b9;
  string local_1b8 [32];
  SPIRVariable *local_198;
  SPIRVariable *var;
  char *local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [38];
  allocator local_13a;
  allocator local_139;
  string local_138 [36];
  char local_114 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [32];
  spirv_cross local_f0 [39];
  byte local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [7];
  bool old_is_using_builtin_array;
  spirv_cross local_a8 [32];
  SPIRType *local_88;
  SPIRType *p_parent_type;
  string type_address_space;
  char *restrict_kw;
  string local_48 [8];
  string type_name;
  bool member_local;
  uint32_t id_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  string *res;
  
  pSVar6 = (SPIRType *)CONCAT44(in_register_00000014,id);
  uVar10 = CONCAT71(in_register_00000009,member);
  uVar4 = (uint32_t)uVar10;
  ::std::__cxx11::string::string(local_48);
  bVar2 = Compiler::type_is_top_level_pointer((Compiler *)type,pSVar6);
  if ((bVar2) || (bVar2 = Compiler::type_is_array_of_pointers((Compiler *)type,pSVar6), bVar2)) {
    if (pSVar6->pointer_depth == 0) {
      __assert_fail("type.pointer_depth > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x3911,
                    "string spirv_cross::CompilerMSL::type_to_glsl(const SPIRType &, uint32_t, bool)"
                   );
    }
    get_type_address_space_abi_cxx11_((CompilerMSL *)&p_parent_type,type,id,member);
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar6->parent_type);
    local_88 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,uVar3);
    bVar2 = type_is_pointer_to_pointer((CompilerMSL *)type,pSVar6);
    if (bVar2) {
      (*(type->super_IVariant)._vptr_IVariant[0x13])(local_c8,type,local_88,uVar10 & 0xffffffff);
      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (local_a8,local_c8,(char (*) [2])0x5eb360,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_parent_type
                 ,(char (*) [2])0x5eb360);
      ::std::__cxx11::string::operator=(local_48,(string *)local_a8);
      ::std::__cxx11::string::~string((string *)local_a8);
      ::std::__cxx11::string::~string((string *)local_c8);
    }
    else {
      while (bVar2 = type_is_pointer((CompilerMSL *)type,local_88), bVar2) {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_88->parent_type);
        local_88 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,uVar3);
      }
      local_c9 = *(byte *)((long)&type[0x21].array.buffer_capacity + 2) & 1;
      bVar2 = Compiler::type_is_top_level_physical_pointer((Compiler *)type,pSVar6);
      if (bVar2) {
        *(undefined1 *)((long)&type[0x21].array.buffer_capacity + 2) = 0;
      }
      (*(type->super_IVariant)._vptr_IVariant[0x13])(local_110,type,local_88,uVar10 & 0xffffffff);
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string>
                (local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &p_parent_type,(char (*) [2])0x5eb360,local_110);
      ::std::__cxx11::string::operator=(local_48,(string *)local_f0);
      ::std::__cxx11::string::~string((string *)local_f0);
      ::std::__cxx11::string::~string((string *)local_110);
      *(byte *)((long)&type[0x21].array.buffer_capacity + 2) = local_c9 & 1;
    }
    if (2 < *(int *)&(pSVar6->super_IVariant).field_0xc - 0x10U) {
      ::std::__cxx11::string::operator+=(local_48,"*");
      pcVar5 = to_restrict((CompilerMSL *)type,uVar4,false);
      if (*pcVar5 != '\0') {
        ::std::__cxx11::string::operator+=(local_48," ");
        ::std::__cxx11::string::operator+=(local_48,pcVar5);
      }
    }
    ::std::__cxx11::string::string((string *)this,local_48);
    local_114[0] = '\x01';
    local_114[1] = '\0';
    local_114[2] = '\0';
    local_114[3] = '\0';
    ::std::__cxx11::string::~string((string *)&p_parent_type);
    goto LAB_004da95e;
  }
  switch(*(undefined4 *)&(pSVar6->super_IVariant).field_0xc) {
  case 1:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"void",&local_139);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_139);
    local_114[0] = '\x01';
    local_114[1] = '\0';
    local_114[2] = '\0';
    local_114[3] = '\0';
    goto LAB_004da95e;
  case 2:
    local_198 = Compiler::maybe_get_backing_variable((Compiler *)type,uVar4);
    if ((local_198 != (SPIRVariable *)0x0) &&
       (uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_198->basevariable),
       uVar3 != 0)) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_198->basevariable);
      local_198 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)type,uVar3);
    }
    if ((((local_198 == (SPIRVariable *)0x0) || (local_198->storage != StorageClassWorkgroup)) &&
        (pSVar6->storage != StorageClassWorkgroup)) && ((in_R8B & 1) == 0)) {
      ::std::__cxx11::string::operator=(local_48,"bool");
    }
    else {
      ::std::__cxx11::string::operator=(local_48,"short");
    }
    break;
  case 3:
  case 0x17:
    ::std::__cxx11::string::operator=(local_48,"char");
    break;
  case 4:
    ::std::__cxx11::string::operator=(local_48,"uchar");
    break;
  case 5:
    ::std::__cxx11::string::operator=(local_48,"short");
    break;
  case 6:
    ::std::__cxx11::string::operator=(local_48,"ushort");
    break;
  case 7:
    ::std::__cxx11::string::operator=(local_48,"int");
    break;
  case 8:
    ::std::__cxx11::string::operator=(local_48,"uint");
    break;
  case 9:
    bVar2 = Options::supports_msl_version((Options *)&type[0x1d].image.sampled,2,2,0);
    if (!bVar2) {
      local_1ba = 1;
      pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_1b8,"64-bit integers are only supported in MSL 2.2 and above.",&local_1b9);
      CompilerError::CompilerError(pCVar8,(string *)local_1b8);
      local_1ba = 0;
      __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::__cxx11::string::operator=(local_48,"long");
    break;
  case 10:
    bVar2 = Options::supports_msl_version((Options *)&type[0x1d].image.sampled,2,2,0);
    if (!bVar2) {
      local_1e2 = 1;
      pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_1e0,"64-bit integers are only supported in MSL 2.2 and above.",&local_1e1);
      CompilerError::CompilerError(pCVar8,(string *)local_1e0);
      local_1e2 = 0;
      __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::__cxx11::string::operator=(local_48,"ulong");
    break;
  case 0xb:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"atomic_uint",&local_13a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_13a);
    local_114[0] = '\x01';
    local_114[1] = '\0';
    local_114[2] = '\0';
    local_114[3] = '\0';
    goto LAB_004da95e;
  case 0xc:
    ::std::__cxx11::string::operator=(local_48,"half");
    break;
  case 0xd:
    ::std::__cxx11::string::operator=(local_48,"float");
    break;
  case 0xe:
    ::std::__cxx11::string::operator=(local_48,"double");
    break;
  case 0xf:
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar6->super_IVariant).self);
    (*(type->super_IVariant)._vptr_IVariant[6])(local_138,type,(ulong)uVar3);
    ::std::__cxx11::string::operator=(local_48,local_138);
    ::std::__cxx11::string::~string(local_138);
    break;
  case 0x10:
  case 0x11:
    (*(type->super_IVariant)._vptr_IVariant[0x17])(this,type,pSVar6,uVar10 & 0xffffffff);
    local_114[0] = '\x01';
    local_114[1] = '\0';
    local_114[2] = '\0';
    local_114[3] = '\0';
    goto LAB_004da95e;
  case 0x12:
    sampler_type_abi_cxx11_(this,type,id);
    local_114[0] = '\x01';
    local_114[1] = '\0';
    local_114[2] = '\0';
    local_114[3] = '\0';
    goto LAB_004da95e;
  case 0x13:
    bVar2 = Options::supports_msl_version((Options *)&type[0x1d].image.sampled,2,4,0);
    if (bVar2) {
      ::std::__cxx11::string::operator=
                (local_48,"raytracing::acceleration_structure<raytracing::instancing>");
    }
    else {
      bVar2 = Options::supports_msl_version((Options *)&type[0x1d].image.sampled,2,3,0);
      if (!bVar2) {
        var_1._6_1_ = 1;
        pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_208,"Acceleration Structure Type is supported in MSL 2.3 and above.",
                   (allocator *)((long)&var_1 + 7));
        CompilerError::CompilerError(pCVar8,(string *)local_208);
        var_1._6_1_ = 0;
        __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      ::std::__cxx11::string::operator=(local_48,"raytracing::instance_acceleration_structure");
    }
    break;
  case 0x14:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)this,
               "raytracing::intersection_query<raytracing::instancing, raytracing::triangle_data>",
               (allocator *)((long)&var_1 + 5));
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&var_1 + 5));
    local_114[0] = '\x01';
    local_114[1] = '\0';
    local_114[2] = '\0';
    local_114[3] = '\0';
    goto LAB_004da95e;
  case 0x15:
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar6->parent_type);
    pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,uVar4);
    (*(type->super_IVariant)._vptr_IVariant[0x13])(local_160,type,pSVar6,uVar10 & 0xffffffff);
    join<char_const(&)[21],std::__cxx11::string,char_const(&)[2]>
              ((spirv_cross *)this,(char (*) [21])"patch_control_point<",local_160,
               (char (*) [2])0x5f0ee9);
    ::std::__cxx11::string::~string((string *)local_160);
    local_114[0] = '\x01';
    local_114[1] = '\0';
    local_114[2] = '\0';
    local_114[3] = '\0';
    goto LAB_004da95e;
  case 0x16:
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar6->parent_type);
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,uVar4);
    (*(type->super_IVariant)._vptr_IVariant[0x13])(local_180,type,pSVar7,uVar10 & 0xffffffff);
    var._4_4_ = (pSVar6->super_IVariant).self.id;
    bVar2 = Compiler::has_decoration((Compiler *)type,var._4_4_,DecorationNoPerspective);
    local_188 = "centroid_perspective";
    if (bVar2) {
      local_188 = "centroid_no_perspective";
    }
    local_188 = local_188 + 9;
    join<char_const(&)[13],std::__cxx11::string,char_const(&)[18],char_const*,char_const(&)[2]>
              ((spirv_cross *)this,(char (*) [13])"interpolant<",local_180,
               (char (*) [18])", interpolation::",&local_188,(char (*) [2])0x5f0ee9);
    ::std::__cxx11::string::~string((string *)local_180);
    local_114[0] = '\x01';
    local_114[1] = '\0';
    local_114[2] = '\0';
    local_114[3] = '\0';
    goto LAB_004da95e;
  default:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"unknown_type",(allocator *)((long)&var_1 + 4));
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&var_1 + 4));
    local_114[0] = '\x01';
    local_114[1] = '\0';
    local_114[2] = '\0';
    local_114[3] = '\0';
    goto LAB_004da95e;
  }
  if (1 < pSVar6->columns) {
    local_218 = Compiler::maybe_get_backing_variable((Compiler *)type,uVar4);
    if ((local_218 != (SPIRVariable *)0x0) &&
       (uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_218->basevariable),
       uVar4 != 0)) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_218->basevariable);
      local_218 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)type,uVar4);
    }
    if ((((local_218 != (SPIRVariable *)0x0) && (local_218->storage == StorageClassWorkgroup)) ||
        (pSVar6->storage == StorageClassWorkgroup)) &&
       (bVar2 = Options::supports_msl_version((Options *)&type[0x1d].image.sampled,3,0,0), !bVar2))
    {
      add_spv_func_and_recompile((CompilerMSL *)type,SPVFuncImplStorageMatrix);
      ::std::operator+((char *)local_238,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "spvStorage_");
      ::std::__cxx11::string::operator=(local_48,local_238);
      ::std::__cxx11::string::~string(local_238);
    }
    ::std::__cxx11::to_string(local_278,pSVar6->columns);
    ::std::operator+(local_258,(char *)local_278);
    ::std::__cxx11::string::operator+=(local_48,(string *)local_258);
    ::std::__cxx11::string::~string((string *)local_258);
    ::std::__cxx11::string::~string((string *)local_278);
  }
  if (1 < pSVar6->vecsize) {
    ::std::__cxx11::to_string(local_298,pSVar6->vecsize);
    ::std::__cxx11::string::operator+=(local_48,(string *)local_298);
    ::std::__cxx11::string::~string((string *)local_298);
  }
  bVar2 = VectorView<unsigned_int>::empty(&(pSVar6->array).super_VectorView<unsigned_int>);
  if ((bVar2) || (bVar2 = using_builtin_array((CompilerMSL *)type), bVar2)) {
    ::std::__cxx11::string::string((string *)this,local_48);
    local_114[0] = '\x01';
    local_114[1] = '\0';
    local_114[2] = '\0';
    local_114[3] = '\0';
  }
  else {
    add_spv_func_and_recompile((CompilerMSL *)type,SPVFuncImplUnsafeArray);
    ::std::__cxx11::string::string((string *)this);
    ::std::__cxx11::string::string((string *)(local_2e8 + 0x28));
    for (local_2e8._36_4_ = 0; uVar1 = local_2e8._36_4_,
        sVar9 = VectorView<unsigned_int>::size(&(pSVar6->array).super_VectorView<unsigned_int>),
        (uint)uVar1 < (uint)sVar9; local_2e8._36_4_ = local_2e8._36_4_ + 1) {
      ::std::__cxx11::string::operator+=((string *)this,"spvUnsafeArray<");
      ::std::__cxx11::string::operator+=((string *)(local_2e8 + 0x28),", ");
      CompilerGLSL::to_array_size_abi_cxx11_((CompilerGLSL *)local_2e8,type,id);
      ::std::__cxx11::string::operator+=((string *)(local_2e8 + 0x28),(string *)local_2e8);
      ::std::__cxx11::string::~string((string *)local_2e8);
      ::std::__cxx11::string::operator+=((string *)(local_2e8 + 0x28),">");
    }
    ::std::operator+(local_308,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_308);
    ::std::__cxx11::string::~string((string *)local_308);
    local_114[0] = '\x01';
    local_114[1] = '\0';
    local_114[2] = '\0';
    local_114[3] = '\0';
    ::std::__cxx11::string::~string((string *)(local_2e8 + 0x28));
  }
LAB_004da95e:
  ::std::__cxx11::string::~string(local_48);
  return this;
}

Assistant:

string CompilerMSL::type_to_glsl(const SPIRType &type, uint32_t id, bool member)
{
	string type_name;

	// Pointer?
	if (type_is_top_level_pointer(type) || type_is_array_of_pointers(type))
	{
		assert(type.pointer_depth > 0);

		const char *restrict_kw;

		auto type_address_space = get_type_address_space(type, id);
		const auto *p_parent_type = &get<SPIRType>(type.parent_type);

		// Work around C pointer qualifier rules. If glsl_type is a pointer type as well
		// we'll need to emit the address space to the right.
		// We could always go this route, but it makes the code unnatural.
		// Prefer emitting thread T *foo over T thread* foo since it's more readable,
		// but we'll have to emit thread T * thread * T constant bar; for example.
		if (type_is_pointer_to_pointer(type))
			type_name = join(type_to_glsl(*p_parent_type, id), " ", type_address_space, " ");
		else
		{
			// Since this is not a pointer-to-pointer, ensure we've dug down to the base type.
			// Some situations chain pointers even though they are not formally pointers-of-pointers.
			while (type_is_pointer(*p_parent_type))
				p_parent_type = &get<SPIRType>(p_parent_type->parent_type);

			// If we're emitting BDA, just use the templated type.
			// Emitting builtin arrays need a lot of cooperation with other code to ensure
			// the C-style nesting works right.
			// FIXME: This is somewhat of a hack.
			bool old_is_using_builtin_array = is_using_builtin_array;
			if (type_is_top_level_physical_pointer(type))
				is_using_builtin_array = false;

			type_name = join(type_address_space, " ", type_to_glsl(*p_parent_type, id));

			is_using_builtin_array = old_is_using_builtin_array;
		}

		switch (type.basetype)
		{
		case SPIRType::Image:
		case SPIRType::SampledImage:
		case SPIRType::Sampler:
			// These are handles.
			break;
		default:
			// Anything else can be a raw pointer.
			type_name += "*";
			restrict_kw = to_restrict(id, false);
			if (*restrict_kw)
			{
				type_name += " ";
				type_name += restrict_kw;
			}
			break;
		}
		return type_name;
	}

	switch (type.basetype)
	{
	case SPIRType::Struct:
		// Need OpName lookup here to get a "sensible" name for a struct.
		// Allow Metal to use the array<T> template to make arrays a value type
		type_name = to_name(type.self);
		break;

	case SPIRType::Image:
	case SPIRType::SampledImage:
		return image_type_glsl(type, id);

	case SPIRType::Sampler:
		return sampler_type(type, id);

	case SPIRType::Void:
		return "void";

	case SPIRType::AtomicCounter:
		return "atomic_uint";

	case SPIRType::ControlPointArray:
		return join("patch_control_point<", type_to_glsl(get<SPIRType>(type.parent_type), id), ">");

	case SPIRType::Interpolant:
		return join("interpolant<", type_to_glsl(get<SPIRType>(type.parent_type), id), ", interpolation::",
		            has_decoration(type.self, DecorationNoPerspective) ? "no_perspective" : "perspective", ">");

	// Scalars
	case SPIRType::Boolean:
	{
		auto *var = maybe_get_backing_variable(id);
		if (var && var->basevariable)
			var = &get<SPIRVariable>(var->basevariable);

		// Need to special-case threadgroup booleans. They are supposed to be logical
		// storage, but MSL compilers will sometimes crash if you use threadgroup bool.
		// Workaround this by using 16-bit types instead and fixup on load-store to this data.
		if ((var && var->storage == StorageClassWorkgroup) || type.storage == StorageClassWorkgroup || member)
			type_name = "short";
		else
			type_name = "bool";
		break;
	}

	case SPIRType::Char:
	case SPIRType::SByte:
		type_name = "char";
		break;
	case SPIRType::UByte:
		type_name = "uchar";
		break;
	case SPIRType::Short:
		type_name = "short";
		break;
	case SPIRType::UShort:
		type_name = "ushort";
		break;
	case SPIRType::Int:
		type_name = "int";
		break;
	case SPIRType::UInt:
		type_name = "uint";
		break;
	case SPIRType::Int64:
		if (!msl_options.supports_msl_version(2, 2))
			SPIRV_CROSS_THROW("64-bit integers are only supported in MSL 2.2 and above.");
		type_name = "long";
		break;
	case SPIRType::UInt64:
		if (!msl_options.supports_msl_version(2, 2))
			SPIRV_CROSS_THROW("64-bit integers are only supported in MSL 2.2 and above.");
		type_name = "ulong";
		break;
	case SPIRType::Half:
		type_name = "half";
		break;
	case SPIRType::Float:
		type_name = "float";
		break;
	case SPIRType::Double:
		type_name = "double"; // Currently unsupported
		break;
	case SPIRType::AccelerationStructure:
		if (msl_options.supports_msl_version(2, 4))
			type_name = "raytracing::acceleration_structure<raytracing::instancing>";
		else if (msl_options.supports_msl_version(2, 3))
			type_name = "raytracing::instance_acceleration_structure";
		else
			SPIRV_CROSS_THROW("Acceleration Structure Type is supported in MSL 2.3 and above.");
		break;
	case SPIRType::RayQuery:
		return "raytracing::intersection_query<raytracing::instancing, raytracing::triangle_data>";

	default:
		return "unknown_type";
	}

	// Matrix?
	if (type.columns > 1)
	{
		auto *var = maybe_get_backing_variable(id);
		if (var && var->basevariable)
			var = &get<SPIRVariable>(var->basevariable);

		// Need to special-case threadgroup matrices. Due to an oversight, Metal's
		// matrix struct prior to Metal 3 lacks constructors in the threadgroup AS,
		// preventing us from default-constructing or initializing matrices in threadgroup storage.
		// Work around this by using our own type as storage.
		if (((var && var->storage == StorageClassWorkgroup) || type.storage == StorageClassWorkgroup) &&
		    !msl_options.supports_msl_version(3, 0))
		{
			add_spv_func_and_recompile(SPVFuncImplStorageMatrix);
			type_name = "spvStorage_" + type_name;
		}

		type_name += to_string(type.columns) + "x";
	}

	// Vector or Matrix?
	if (type.vecsize > 1)
		type_name += to_string(type.vecsize);

	if (type.array.empty() || using_builtin_array())
	{
		return type_name;
	}
	else
	{
		// Allow Metal to use the array<T> template to make arrays a value type
		add_spv_func_and_recompile(SPVFuncImplUnsafeArray);
		string res;
		string sizes;

		for (uint32_t i = 0; i < uint32_t(type.array.size()); i++)
		{
			res += "spvUnsafeArray<";
			sizes += ", ";
			sizes += to_array_size(type, i);
			sizes += ">";
		}

		res += type_name + sizes;
		return res;
	}
}